

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O3

bool __thiscall
crnlib::dxt1_endpoint_optimizer::evaluate_solution_fast
          (dxt1_endpoint_optimizer *this,dxt1_solution_coordinates *coords,bool alternate_rounding)

{
  vector<unsigned_char> *pvVar1;
  uint64 *puVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  ushort uVar6;
  params *ppVar7;
  unique_color *puVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  byte bVar20;
  int iVar21;
  ulong uVar22;
  int iVar23;
  int iVar24;
  uint uVar25;
  int iVar26;
  uint uVar27;
  bool bVar28;
  byte local_c8 [16];
  vector<unsigned_char> *local_b8;
  uint local_ac;
  ulong local_a8;
  uint64 *local_a0;
  elemental_vector *local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  int local_60;
  undefined1 local_5c [12];
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  (this->m_trial_solution).m_coords = *coords;
  pvVar1 = &(this->m_trial_solution).m_selectors;
  uVar19 = (this->m_unique_colors).m_size;
  uVar15 = (this->m_trial_solution).m_selectors.m_size;
  local_98 = (elemental_vector *)pvVar1;
  if (uVar15 != uVar19) {
    if (uVar15 <= uVar19) {
      if ((this->m_trial_solution).m_selectors.m_capacity < uVar19) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)pvVar1,uVar19,uVar15 + 1 == uVar19,1,(object_mover)0x0,false)
        ;
        uVar15 = (this->m_trial_solution).m_selectors.m_size;
      }
      memset(pvVar1->m_p + uVar15,0,(ulong)(uVar19 - uVar15));
    }
    (this->m_trial_solution).m_selectors.m_size = uVar19;
  }
  (this->m_trial_solution).m_error = (this->m_best_solution).m_error;
  (this->m_trial_solution).m_alpha_block = false;
  ppVar7 = this->m_pParams;
  local_ac = 1;
  if (ppVar7->m_pixels_have_alpha == false) {
    local_a8 = 1;
    if (ppVar7->m_force_alpha_blocks == false) {
      local_ac = (uint)ppVar7->m_use_alpha_blocks;
      local_a8 = 0;
    }
  }
  else {
    local_a8 = 1;
  }
  pvVar1 = &this->m_trial_selectors;
  uVar19 = (this->m_unique_colors).m_size;
  uVar15 = (this->m_trial_selectors).m_size;
  local_b8 = pvVar1;
  if (uVar15 != uVar19) {
    if (uVar15 <= uVar19) {
      if ((this->m_trial_selectors).m_capacity < uVar19) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)pvVar1,uVar19,uVar15 + 1 == uVar19,1,(object_mover)0x0,false)
        ;
        uVar15 = (this->m_trial_selectors).m_size;
      }
      memset(pvVar1->m_p + uVar15,0,(ulong)(uVar19 - uVar15));
    }
    (this->m_trial_selectors).m_size = uVar19;
  }
  local_a0 = &(this->m_trial_solution).m_error;
  dxt1_block::unpack_color((dxt1_block *)local_5c,coords->m_low_color,true,0xff);
  local_c8[0] = local_5c[0];
  local_c8[1] = local_5c[1];
  local_c8[2] = local_5c[2];
  dxt1_block::unpack_color((dxt1_block *)local_5c,coords->m_high_color,true,0xff);
  local_c8[4] = local_5c[0];
  local_c8[5] = local_5c[1];
  local_c8[6] = local_5c[2];
  uVar17 = (uint)local_5c[0] - (uint)local_c8[0];
  uVar15 = (uint)local_5c[1] - (uint)local_c8[1];
  bVar28 = this->m_perceptual == false;
  uVar19 = uVar15 * 0x18;
  if (bVar28) {
    uVar19 = uVar15;
  }
  uVar15 = uVar17 * 8;
  if (bVar28) {
    uVar15 = uVar17;
  }
  if ((uint)local_a8 <= local_ac) {
    iVar18 = (uint)local_5c[2] - (uint)local_c8[2];
    iVar9 = local_5c[0] * uVar15 + (uint)local_5c[2] * iVar18 + local_5c[1] * uVar19;
    iVar23 = local_c8[0] * uVar15 + (uint)local_c8[2] * iVar18 + local_c8[1] * uVar19;
    local_64 = ((uint)local_5c[0] + (uint)alternate_rounding + (uint)local_c8[0] * 2) / 3;
    local_68 = ((uint)local_5c[1] + (uint)alternate_rounding + (uint)local_c8[1] * 2) / 3;
    iVar24 = (uint)local_c8[0] + (uint)alternate_rounding;
    iVar26 = (uint)local_c8[1] + (uint)alternate_rounding;
    iVar11 = (uint)local_c8[2] + (uint)alternate_rounding;
    local_6c = ((uint)local_5c[2] + (uint)alternate_rounding + (uint)local_c8[2] * 2) / 3;
    iVar16 = (local_6c & 0xff) * iVar18 + (local_68 & 0xff) * uVar19 + (local_64 & 0xff) * uVar15;
    local_70 = (iVar24 + (uint)local_5c[0] * 2) / 3;
    local_74 = (iVar26 + (uint)local_5c[1] * 2) / 3;
    local_78 = (iVar11 + (uint)local_5c[2] * 2) / 3;
    iVar21 = (local_78 & 0xff) * iVar18 + (local_74 & 0xff) * uVar19 + (local_70 & 0xff) * uVar15;
    uVar25 = iVar24 + (uint)local_5c[0] >> 1;
    local_38 = (ulong)uVar25;
    uVar27 = iVar26 + (uint)local_5c[1] >> 1;
    local_40 = (ulong)uVar27;
    uVar17 = iVar11 + (uint)local_5c[2] >> 1;
    local_48 = (ulong)uVar17;
    iVar11 = (uVar17 & 0xff) * iVar18 + (uVar25 & 0xff) * uVar15 + (uVar27 & 0xff) * uVar19;
    local_60 = iVar21 + iVar9;
    local_90 = (ulong)(uint)(iVar21 + iVar16);
    local_88 = (ulong)(uint)(iVar16 + iVar23);
    local_80 = (ulong)(uint)(iVar23 + iVar11);
    uVar14 = local_a8;
    local_5c._4_8_ = (ulong)uVar19;
    local_50 = (ulong)uVar15;
    do {
      if ((int)uVar14 == 0) {
        local_c8[8] = (char)local_64;
        local_c8[9] = (char)local_68;
        local_c8[10] = (char)local_6c;
        local_c8[0xc] = (char)local_70;
        local_c8[0xd] = (char)local_74;
        local_c8[0xe] = (char)local_78;
        lVar12 = (long)(int)(this->m_unique_colors).m_size;
        if (lVar12 < 1) goto LAB_00171640;
        uVar13 = lVar12 + 1;
        uVar10 = 0;
        do {
          puVar8 = (this->m_unique_colors).m_p;
          bVar3 = puVar8[uVar13 - 2].m_color.field_0.field_0.r;
          bVar4 = puVar8[uVar13 - 2].m_color.field_0.field_0.g;
          bVar5 = puVar8[uVar13 - 2].m_color.field_0.field_0.b;
          iVar16 = iVar18 * 2 * (uint)bVar5 + uVar19 * 2 * (uint)bVar4 + uVar15 * 2 * (uint)bVar3;
          bVar20 = (iVar16 < local_60) * '\x02' + 1;
          if (iVar16 < (int)local_90) {
            bVar20 = ((int)local_88 <= iVar16) * '\x02';
          }
          uVar22 = (ulong)bVar20;
          if (this->m_perceptual == true) {
            iVar21 = (uint)bVar3 - (uint)local_c8[uVar22 * 4];
            iVar23 = (uint)bVar4 - (uint)local_c8[uVar22 * 4 + 1];
            iVar16 = (uint)bVar5 - (uint)local_c8[uVar22 * 4 + 2];
            uVar17 = iVar16 * iVar16 + iVar23 * iVar23 * 0x19 + iVar21 * iVar21 * 8;
          }
          else if (this->m_pParams->m_grayscale_sampling == true) {
            iVar16 = ((uint)bVar5 * 0x1d2f + 0x8000 + (uint)bVar4 * 0x9646 + (uint)bVar3 * 0x4c8b >>
                     0x10) - ((uint)local_c8[uVar22 * 4 + 2] * 0x1d2f + 0x8000 +
                              (uint)local_c8[uVar22 * 4 + 1] * 0x9646 +
                              (uint)local_c8[uVar22 * 4] * 0x4c8b >> 0x10);
            uVar17 = iVar16 * iVar16;
          }
          else {
            iVar21 = (uint)bVar3 - (uint)local_c8[uVar22 * 4];
            iVar23 = (uint)bVar4 - (uint)local_c8[uVar22 * 4 + 1];
            iVar16 = (uint)bVar5 - (uint)local_c8[uVar22 * 4 + 2];
            uVar17 = iVar16 * iVar16 + iVar23 * iVar23 + iVar21 * iVar21;
          }
          uVar10 = uVar10 + (ulong)puVar8[uVar13 - 2].m_weight * (ulong)uVar17;
          if (*local_a0 <= uVar10) break;
          local_b8->m_p[uVar13 - 2] = bVar20;
          uVar13 = uVar13 - 1;
        } while (1 < uVar13);
      }
      else {
        local_c8[8] = (char)local_38;
        local_c8[9] = (char)local_40;
        local_c8[10] = (char)local_48;
        lVar12 = (long)(int)(this->m_unique_colors).m_size;
        if (lVar12 < 1) {
LAB_00171640:
          uVar10 = 0;
        }
        else {
          uVar13 = lVar12 + 1;
          uVar10 = 0;
          do {
            puVar8 = (this->m_unique_colors).m_p;
            bVar3 = puVar8[uVar13 - 2].m_color.field_0.field_0.r;
            bVar4 = puVar8[uVar13 - 2].m_color.field_0.field_0.g;
            bVar5 = puVar8[uVar13 - 2].m_color.field_0.field_0.b;
            iVar16 = iVar18 * 2 * (uint)bVar5 + uVar19 * 2 * (uint)bVar4 + uVar15 * 2 * (uint)bVar3;
            bVar20 = (iVar16 < iVar11 + iVar9) + 1;
            if (iVar16 < (int)local_80) {
              bVar20 = 0;
            }
            uVar22 = (ulong)bVar20;
            if (this->m_perceptual == true) {
              iVar21 = (uint)bVar3 - (uint)local_c8[uVar22 * 4];
              iVar23 = (uint)bVar4 - (uint)local_c8[uVar22 * 4 + 1];
              iVar16 = (uint)bVar5 - (uint)local_c8[uVar22 * 4 + 2];
              uVar17 = iVar16 * iVar16 + iVar23 * iVar23 * 0x19 + iVar21 * iVar21 * 8;
            }
            else if (this->m_pParams->m_grayscale_sampling == true) {
              iVar16 = ((uint)bVar5 * 0x1d2f + 0x8000 + (uint)bVar4 * 0x9646 + (uint)bVar3 * 0x4c8b
                       >> 0x10) -
                       ((uint)local_c8[uVar22 * 4 + 2] * 0x1d2f + 0x8000 +
                        (uint)local_c8[uVar22 * 4 + 1] * 0x9646 +
                        (uint)local_c8[uVar22 * 4] * 0x4c8b >> 0x10);
              uVar17 = iVar16 * iVar16;
            }
            else {
              iVar21 = (uint)bVar3 - (uint)local_c8[uVar22 * 4];
              iVar23 = (uint)bVar4 - (uint)local_c8[uVar22 * 4 + 1];
              iVar16 = (uint)bVar5 - (uint)local_c8[uVar22 * 4 + 2];
              uVar17 = iVar16 * iVar16 + iVar23 * iVar23 + iVar21 * iVar21;
            }
            uVar10 = uVar10 + (ulong)puVar8[uVar13 - 2].m_weight * (ulong)uVar17;
            if (*local_a0 <= uVar10) break;
            local_b8->m_p[uVar13 - 2] = bVar20;
            uVar13 = uVar13 - 1;
          } while (1 < uVar13);
        }
      }
      local_a8 = uVar14;
      if (uVar10 < *local_a0) {
        (this->m_trial_solution).m_error = uVar10;
        (this->m_trial_solution).m_alpha_block = (int)uVar14 != 0;
        uVar17 = (this->m_trial_selectors).m_size;
        if ((this->m_trial_solution).m_selectors.m_capacity < uVar17) {
          if ((uchar *)local_98->m_p != (uchar *)0x0) {
            crnlib_free(local_98->m_p);
            local_98->m_p = (uchar *)0x0;
            *(undefined8 *)&local_98->m_size = 0;
            uVar17 = (this->m_trial_selectors).m_size;
          }
          elemental_vector::increase_capacity(local_98,uVar17,false,1,(object_mover)0x0,false);
          uVar17 = (this->m_trial_selectors).m_size;
        }
        else if ((this->m_trial_solution).m_selectors.m_size != 0) {
          (this->m_trial_solution).m_selectors.m_size = 0;
        }
        memcpy((this->m_trial_solution).m_selectors.m_p,(this->m_trial_selectors).m_p,(ulong)uVar17)
        ;
        (this->m_trial_solution).m_selectors.m_size = (this->m_trial_selectors).m_size;
      }
      uVar14 = (ulong)((uint)local_a8 + 1);
    } while ((uint)local_a8 != local_ac);
  }
  puVar2 = &(this->m_best_solution).m_error;
  if (((this->m_trial_solution).m_alpha_block == false) &&
     (uVar6 = (this->m_trial_solution).m_coords.m_low_color,
     uVar6 == (this->m_trial_solution).m_coords.m_high_color)) {
    bVar28 = (~uVar6 & 0x1f) != 0;
    if (bVar28) {
      (this->m_trial_solution).m_coords.m_low_color = uVar6 + 1;
    }
    else {
      (this->m_trial_solution).m_coords.m_high_color = uVar6 - 1;
    }
    if ((this->m_unique_colors).m_size != 0) {
      uVar14 = 0;
      do {
        (this->m_trial_solution).m_selectors.m_p[uVar14] = bVar28;
        uVar14 = uVar14 + 1;
      } while (uVar14 < (this->m_unique_colors).m_size);
    }
  }
  uVar14 = *local_a0;
  uVar10 = *puVar2;
  if (uVar14 < uVar10) {
    uVar19 = (this->m_trial_solution).m_selectors.m_size;
    (this->m_best_solution).m_coords = (this->m_trial_solution).m_coords;
    if ((this->m_best_solution).m_selectors.m_capacity < uVar19) {
      pvVar1 = &(this->m_best_solution).m_selectors;
      if (pvVar1->m_p != (uchar *)0x0) {
        crnlib_free(pvVar1->m_p);
        pvVar1->m_p = (uchar *)0x0;
        (this->m_best_solution).m_selectors.m_size = 0;
        (this->m_best_solution).m_selectors.m_capacity = 0;
        uVar19 = (this->m_trial_solution).m_selectors.m_size;
      }
      elemental_vector::increase_capacity
                ((elemental_vector *)pvVar1,uVar19,false,1,(object_mover)0x0,false);
      uVar19 = (this->m_trial_solution).m_selectors.m_size;
    }
    else if ((this->m_best_solution).m_selectors.m_size != 0) {
      (this->m_best_solution).m_selectors.m_size = 0;
    }
    memcpy((this->m_best_solution).m_selectors.m_p,(this->m_trial_solution).m_selectors.m_p,
           (ulong)uVar19);
    (this->m_best_solution).m_selectors.m_size = (this->m_trial_solution).m_selectors.m_size;
    *(undefined4 *)&(this->m_best_solution).m_alpha_block = *(undefined4 *)(local_a0 + 1);
    *puVar2 = *local_a0;
  }
  return uVar14 < uVar10;
}

Assistant:

bool dxt1_endpoint_optimizer::evaluate_solution_fast(const dxt1_solution_coordinates& coords, bool alternate_rounding)
    {
        m_trial_solution.m_coords = coords;
        m_trial_solution.m_selectors.resize(m_unique_colors.size());
        m_trial_solution.m_error = m_best_solution.m_error;
        m_trial_solution.m_alpha_block = false;

        uint first_block_type = 0;
        uint last_block_type = 1;

        if ((m_pParams->m_pixels_have_alpha) || (m_pParams->m_force_alpha_blocks))
        {
            first_block_type = 1;
        }
        else if (!m_pParams->m_use_alpha_blocks)
        {
            last_block_type = 0;
        }

        m_trial_selectors.resize(m_unique_colors.size());

        color_quad_u8 colors[cDXT1SelectorValues];
        colors[0] = dxt1_block::unpack_color(coords.m_low_color, true);
        colors[1] = dxt1_block::unpack_color(coords.m_high_color, true);

        int vr = colors[1].r - colors[0].r;
        int vg = colors[1].g - colors[0].g;
        int vb = colors[1].b - colors[0].b;
        if (m_perceptual)
        {
            vr *= 8;
            vg *= 24;
        }

        int stops[4];
        stops[0] = colors[0].r * vr + colors[0].g * vg + colors[0].b * vb;
        stops[1] = colors[1].r * vr + colors[1].g * vg + colors[1].b * vb;

        int dirr = vr * 2;
        int dirg = vg * 2;
        int dirb = vb * 2;

        for (uint block_type = first_block_type; block_type <= last_block_type; block_type++)
        {
            uint64 trial_error = 0;

            if (!block_type)
            {
                colors[2].set_noclamp_rgba((colors[0].r * 2 + colors[1].r + alternate_rounding) / 3, (colors[0].g * 2 + colors[1].g + alternate_rounding) / 3, (colors[0].b * 2 + colors[1].b + alternate_rounding) / 3, 255U);
                colors[3].set_noclamp_rgba((colors[1].r * 2 + colors[0].r + alternate_rounding) / 3, (colors[1].g * 2 + colors[0].g + alternate_rounding) / 3, (colors[1].b * 2 + colors[0].b + alternate_rounding) / 3, 255U);

                stops[2] = colors[2].r * vr + colors[2].g * vg + colors[2].b * vb;
                stops[3] = colors[3].r * vr + colors[3].g * vg + colors[3].b * vb;

                // 0 2 3 1
                int c0Point = stops[1] + stops[3];
                int halfPoint = stops[3] + stops[2];
                int c3Point = stops[2] + stops[0];

                for (int unique_color_index = (int)m_unique_colors.size() - 1; unique_color_index >= 0; unique_color_index--)
                {
                    const color_quad_u8& c = m_unique_colors[unique_color_index].m_color;

                    int dot = c.r * dirr + c.g * dirg + c.b * dirb;

                    uint8 best_color_index;
                    if (dot >= halfPoint)
                    {
                        best_color_index = (dot < c0Point) ? 3 : 1;
                    }
                    else
                    {
                        best_color_index = (dot < c3Point) ? 0 : 2;
                    }

                    uint best_error = color_distance(m_perceptual, c, colors[best_color_index], false);

                    trial_error += best_error * static_cast<uint64>(m_unique_colors[unique_color_index].m_weight);
                    if (trial_error >= m_trial_solution.m_error)
                    {
                        break;
                    }

                    m_trial_selectors[unique_color_index] = static_cast<uint8>(best_color_index);
                }
            }
            else
            {
                colors[2].set_noclamp_rgba((colors[0].r + colors[1].r + alternate_rounding) >> 1, (colors[0].g + colors[1].g + alternate_rounding) >> 1, (colors[0].b + colors[1].b + alternate_rounding) >> 1, 255U);

                stops[2] = colors[2].r * vr + colors[2].g * vg + colors[2].b * vb;

                // 0 2 1
                int c02Point = stops[0] + stops[2];
                int c21Point = stops[2] + stops[1];

                for (int unique_color_index = (int)m_unique_colors.size() - 1; unique_color_index >= 0; unique_color_index--)
                {
                    const color_quad_u8& c = m_unique_colors[unique_color_index].m_color;

                    int dot = c.r * dirr + c.g * dirg + c.b * dirb;

                    uint8 best_color_index;
                    if (dot < c02Point)
                    {
                        best_color_index = 0;
                    }
                    else if (dot < c21Point)
                    {
                        best_color_index = 2;
                    }
                    else
                    {
                        best_color_index = 1;
                    }

                    uint best_error = color_distance(m_perceptual, c, colors[best_color_index], false);

                    trial_error += best_error * static_cast<uint64>(m_unique_colors[unique_color_index].m_weight);
                    if (trial_error >= m_trial_solution.m_error)
                    {
                        break;
                    }

                    m_trial_selectors[unique_color_index] = static_cast<uint8>(best_color_index);
                }
            }

            if (trial_error < m_trial_solution.m_error)
            {
                m_trial_solution.m_error = trial_error;
                m_trial_solution.m_alpha_block = (block_type != 0);
                m_trial_solution.m_selectors = m_trial_selectors;
            }
        }

        if ((!m_trial_solution.m_alpha_block) && (m_trial_solution.m_coords.m_low_color == m_trial_solution.m_coords.m_high_color))
        {
            uint s;
            if ((m_trial_solution.m_coords.m_low_color & 31) != 31)
            {
                m_trial_solution.m_coords.m_low_color++;
                s = 1;
            }
            else
            {
                m_trial_solution.m_coords.m_high_color--;
                s = 0;
            }

            for (uint i = 0; i < m_unique_colors.size(); i++)
            {
                m_trial_solution.m_selectors[i] = static_cast<uint8>(s);
            }
        }

        if (m_trial_solution.m_error < m_best_solution.m_error)
        {
            m_best_solution = m_trial_solution;
            return true;
        }

        return false;
    }